

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cc
# Opt level: O3

void __thiscall WaveformGenerator::set_chip_model(WaveformGenerator *this,chip_model model)

{
  reg8 *prVar1;
  reg8 *prVar2;
  reg8 *prVar3;
  reg8 *prVar4;
  
  if (model == MOS6581) {
    prVar1 = wave6581_PST;
    prVar2 = wave6581_PS_;
    prVar3 = wave6581_P_T;
    prVar4 = wave6581__ST;
  }
  else {
    prVar1 = wave8580_PST;
    prVar2 = wave8580_PS_;
    prVar3 = wave8580_P_T;
    prVar4 = wave8580__ST;
  }
  this->wave__ST = prVar4;
  this->wave_P_T = prVar3;
  this->wave_PS_ = prVar2;
  this->wave_PST = prVar1;
  return;
}

Assistant:

void WaveformGenerator::set_chip_model(chip_model model)
{
  if (model == MOS6581) {
    wave__ST = wave6581__ST;
    wave_P_T = wave6581_P_T;
    wave_PS_ = wave6581_PS_;
    wave_PST = wave6581_PST;
  }
  else {
    wave__ST = wave8580__ST;
    wave_P_T = wave8580_P_T;
    wave_PS_ = wave8580_PS_;
    wave_PST = wave8580_PST;
  }
}